

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd.c
# Opt level: O0

void intobucket(bucket_conflict *b,list_conflict head,list_conflict tail,int size,group_conflict g)

{
  bucket_conflict pbVar1;
  bucket newb;
  bucket btemp;
  group_conflict g_local;
  int size_local;
  list_conflict tail_local;
  list_conflict head_local;
  bucket_conflict *b_local;
  
  newb = *b;
  if ((newb == (bucket_conflict)0x0) || (newb->tag != g)) {
    pbVar1 = (bucket_conflict)allocmem(bucketmem,0x28);
    pbVar1->next = newb;
    pbVar1->head = head;
    pbVar1->size = size;
    pbVar1->tag = g;
    *b = pbVar1;
    newb = pbVar1;
  }
  else {
    newb->tail->next = head;
    newb->size = size + newb->size;
  }
  tail->next = (list)0x0;
  newb->tail = tail;
  return;
}

Assistant:

static void intobucket(bucket *b, list h, list t, int size,
                       character ch, character *chmin, character *chmax)
{
   if (!b->head) {
      b->head = h;
      b->tail = t;
      b->size = size;
      if (ch != '\0') {
         if (ch < *chmin) *chmin = ch;
         if (ch > *chmax) *chmax = ch;
      }
   } else {
      b->tail->next = h;
      b->tail = t;
      b->size += size;
   }
}